

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<int,_float,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<int,_float,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          int *key,float *value)

{
  int iVar1;
  ulong __holeIndex;
  int iVar2;
  pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_> pVar3;
  pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_> *__first;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_>_&)>
  local_20;
  
  __first = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first[__holeIndex].first.value = *key;
    __first[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    pVar3 = __first[__holeIndex];
  }
  else {
    iVar2 = *key;
    iVar1 = (__first->first).value;
    if (iVar2 <= iVar1) {
      return;
    }
    if (1 < (long)__holeIndex) {
      pVar3 = __first[__holeIndex - 1];
      __first[__holeIndex - 1].first.value = iVar1;
      __first[__holeIndex - 1].second.value = (__first->second).value;
      ::std::
      __adjust_heap<std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>*,long,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>const&,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>const&)>>
                (__first,0,(long)(__holeIndex * 8 + -8) >> 3,pVar3,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<float>_>_&)>
                  )Compare);
      __first = this->heap;
      __holeIndex = this->size;
      iVar2 = *key;
    }
    __first[__holeIndex - 1].first.value = iVar2;
    __first[__holeIndex - 1].second.value = *value;
    pVar3 = __first[__holeIndex - 1];
    __holeIndex = ((long)(__holeIndex * 8) >> 3) - 1;
  }
  local_20._M_comp = Compare;
  ::std::
  __push_heap<std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>*,long,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>const&,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<float>>const&)>>
            (__first,__holeIndex,0,pVar3,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}